

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O2

void __thiscall rsg::Function::tokenize(Function *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *this_00;
  pointer ppVVar1;
  Token local_48;
  Token local_38;
  
  VariableType::tokenizeShortType(&this->m_returnType,str);
  Token::Token(&local_48,(this->m_name)._M_dataplus._M_p);
  TokenStream::operator<<(str,&local_48);
  Token::~Token(&local_48);
  local_48.m_type = LEFT_PAREN;
  TokenStream::operator<<(str,&local_48);
  Token::~Token(&local_48);
  for (ppVVar1 = (this->m_parameters).
                 super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppVVar1 !=
      (this->m_parameters).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppVVar1 = ppVVar1 + 1) {
    if (ppVVar1 !=
        (this->m_parameters).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_48.m_type = COMMA;
      TokenStream::operator<<(str,&local_48);
      Token::~Token(&local_48);
    }
    Variable::tokenizeDeclaration(*ppVVar1,state,str);
  }
  local_48.m_type = RIGHT_PAREN;
  this_00 = TokenStream::operator<<(str,&local_48);
  local_38.m_type = NEWLINE;
  TokenStream::operator<<(this_00,&local_38);
  Token::~Token(&local_38);
  Token::~Token(&local_48);
  BlockStatement::tokenize(&this->m_functionBlock,state,str);
  return;
}

Assistant:

void Function::tokenize (GeneratorState& state, TokenStream& str) const
{
	// Return type
	m_returnType.tokenizeShortType(str);

	// Function name
	DE_ASSERT(m_name != "");
	str << Token(m_name.c_str());

	// Parameters
	str << Token::LEFT_PAREN;

	for (vector<Variable*>::const_iterator i = m_parameters.begin(); i != m_parameters.end(); i++)
	{
		if (i != m_parameters.begin())
			str << Token::COMMA;
		(*i)->tokenizeDeclaration(state, str);
	}

	str << Token::RIGHT_PAREN << Token::NEWLINE;

	// Tokenize body
	m_functionBlock.tokenize(state, str);
}